

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O0

bool __thiscall
Catch::Detail::CaseInsensitiveLess::operator()
          (CaseInsensitiveLess *this,StringRef lhs,StringRef rhs)

{
  bool bVar1;
  const_iterator pcVar2;
  const_iterator pcVar3;
  const_iterator pcVar4;
  const_iterator pcVar5;
  CaseInsensitiveLess *this_local;
  StringRef rhs_local;
  StringRef lhs_local;
  
  rhs_local.m_start = (char *)rhs.m_size;
  this_local = (CaseInsensitiveLess *)rhs.m_start;
  rhs_local.m_size = (size_type)lhs.m_start;
  pcVar2 = StringRef::begin((StringRef *)&rhs_local.m_size);
  pcVar3 = StringRef::end((StringRef *)&rhs_local.m_size);
  pcVar4 = StringRef::begin((StringRef *)&this_local);
  pcVar5 = StringRef::end((StringRef *)&this_local);
  bVar1 = std::operator()(pcVar2,pcVar3,pcVar4,pcVar5);
  return bVar1;
}

Assistant:

bool CaseInsensitiveLess::operator()( StringRef lhs,
                                              StringRef rhs ) const {
            return std::lexicographical_compare(
                lhs.begin(), lhs.end(),
                rhs.begin(), rhs.end(),
                []( char l, char r ) { return toLower( l ) < toLower( r ); } );
        }